

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

sg_pipeline sg_make_pipeline(sg_pipeline_desc *desc)

{
  sg_pipeline pip_id;
  _sg_pipeline_t *pip;
  sg_pipeline_desc desc_def;
  sg_pipeline_desc sStack_248;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f3b,"sg_pipeline sg_make_pipeline(const sg_pipeline_desc *)");
  }
  if (desc == (sg_pipeline_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f3c,"sg_pipeline sg_make_pipeline(const sg_pipeline_desc *)");
  }
  _sg_pipeline_desc_defaults(&sStack_248,desc);
  pip_id = _sg_alloc_pipeline();
  if (pip_id.id == 0) {
    _sg_log("pipeline pool exhausted!");
  }
  else {
    pip = _sg_pipeline_at(&_sg.pools,pip_id.id);
    if ((pip->slot).state != SG_RESOURCESTATE_ALLOC) {
      __assert_fail("pip && (pip->slot.state == SG_RESOURCESTATE_ALLOC)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f41,"sg_pipeline sg_make_pipeline(const sg_pipeline_desc *)");
    }
    _sg_init_pipeline(pip,&sStack_248);
    if (((pip->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
      __assert_fail("(pip->slot.state == SG_RESOURCESTATE_VALID) || (pip->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f43,"sg_pipeline sg_make_pipeline(const sg_pipeline_desc *)");
    }
  }
  return (sg_pipeline)pip_id.id;
}

Assistant:

inline sg_pipeline sg_make_pipeline(const sg_pipeline_desc& desc) { return sg_make_pipeline(&desc); }